

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  ImFont *pIVar6;
  size_t data_size;
  size_t local_148 [2];
  undefined4 local_138;
  undefined1 local_134;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined8 local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined8 local_f4;
  char local_ec [44];
  undefined8 local_c0;
  ImFontConfig local_b8;
  
  local_148[0] = 0;
  pIVar6 = (ImFont *)0x0;
  pvVar3 = ImFileLoadToMemory(filename,"rb",local_148,0);
  if (pvVar3 != (void *)0x0) {
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_148[1] = 0;
      local_138 = 0;
      local_11c = 0;
      uStack_114 = 0;
      local_134 = 1;
      local_130 = 0;
      uStack_128 = 0x100000003;
      local_120 = 0;
      local_108 = 0;
      local_100 = 0x7f7fffff00000000;
      local_f8 = 0;
      local_f4 = 0x3f80000000000000;
      local_ec[0] = '\0';
      local_ec[1] = '\0';
      local_ec[2] = '\0';
      local_ec[3] = '\0';
      local_ec[4] = '\0';
      local_ec[5] = '\0';
      local_ec[6] = '\0';
      local_ec[7] = '\0';
      local_ec[8] = '\0';
      local_ec[9] = '\0';
      local_ec[10] = '\0';
      local_ec[0xb] = '\0';
      local_ec[0xc] = '\0';
      local_ec[0xd] = '\0';
      local_ec[0xe] = '\0';
      local_ec[0xf] = '\0';
      local_ec[0x10] = '\0';
      local_ec[0x11] = '\0';
      local_ec[0x12] = '\0';
      local_ec[0x13] = '\0';
      local_ec[0x14] = '\0';
      local_ec[0x15] = '\0';
      local_ec[0x16] = '\0';
      local_ec[0x17] = '\0';
      local_ec[0x18] = '\0';
      local_ec[0x19] = '\0';
      local_ec[0x1a] = '\0';
      local_ec[0x1b] = '\0';
      local_ec[0x1c] = '\0';
      local_ec[0x1d] = '\0';
      local_ec[0x1e] = '\0';
      local_ec[0x1f] = '\0';
      local_ec[0x20] = '\0';
      local_ec[0x21] = '\0';
      local_ec[0x22] = '\0';
      local_ec[0x23] = '\0';
      local_ec[0x24] = '\0';
      local_ec[0x25] = '\0';
      local_ec[0x26] = '\0';
      local_ec[0x27] = '\0';
      local_c0 = 0;
    }
    else {
      memcpy(local_148 + 1,font_cfg_template,0x88);
    }
    if (local_ec[0] == '\0') {
      sVar4 = strlen(filename);
      pcVar5 = filename + sVar4;
      do {
        if ((pcVar5 <= filename) || (pcVar1 = pcVar5 + -1, *pcVar1 == '\\')) break;
        pcVar5 = pcVar5 + -1;
      } while (*pcVar1 != '/');
      ImFormatString(local_ec,0x28,"%s, %.0fpx",SUB84((double)size_pixels,0));
    }
    iVar2 = (int)local_148[0];
    memcpy(&local_b8,local_148 + 1,0x88);
    local_b8.FontDataSize = iVar2;
    if (glyph_ranges != (ImWchar *)0x0) {
      local_b8.GlyphRanges = glyph_ranges;
    }
    local_b8.FontData = pvVar3;
    local_b8.SizePixels = size_pixels;
    pIVar6 = AddFont(this,&local_b8);
  }
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT(0); // Could not load file.
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}